

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O3

Result __thiscall wabt::anon_unknown_7::Validator::OnBrTableExpr(Validator *this,BrTableExpr *expr)

{
  pointer pVVar1;
  TypeChecker *this_00;
  Var *var;
  pointer pVVar2;
  
  this->expr_loc_ = &(expr->super_ExprMixin<(wabt::ExprType)10>).super_Expr.loc;
  this_00 = &this->typechecker_;
  TypeChecker::BeginBrTable(this_00);
  pVVar1 = (expr->targets).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pVVar2 = (expr->targets).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>._M_impl.
                super__Vector_impl_data._M_start; pVVar2 != pVVar1; pVVar2 = pVVar2 + 1) {
    if (pVVar2->type_ != Index) goto LAB_00f54c01;
    TypeChecker::OnBrTableTarget(this_00,(pVVar2->field_2).index_);
  }
  if ((expr->default_target).type_ == Index) {
    TypeChecker::OnBrTableTarget(this_00,(expr->default_target).field_2.index_);
    TypeChecker::EndBrTable(this_00);
    return (Result)Ok;
  }
LAB_00f54c01:
  __assert_fail("is_index()",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/ir.h"
                ,0x36,"Index wabt::Var::index() const");
}

Assistant:

Result Validator::OnBrTableExpr(BrTableExpr* expr) {
  expr_loc_ = &expr->loc;
  typechecker_.BeginBrTable();
  for (const Var& var : expr->targets) {
    typechecker_.OnBrTableTarget(var.index());
  }
  typechecker_.OnBrTableTarget(expr->default_target.index());
  typechecker_.EndBrTable();
  return Result::Ok;
}